

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  long in_RDX;
  long lVar4;
  long lVar5;
  int k;
  long lVar6;
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  Matrix2f MVar8;
  
  auVar7 = ZEXT1664(ZEXT816(0) << 0x40);
  Matrix2f::Matrix2f(x,0.0);
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    lVar4 = in_RDX;
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      fVar1 = y->m_elements[lVar5 * 2 + lVar3];
      auVar7 = ZEXT464((uint)fVar1);
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar4 + lVar6 * 8)),ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)((long)x + lVar6 * 2 * 4)));
        in_ZMM1 = ZEXT1664(auVar2);
        *(int *)((long)x + lVar6 * 2 * 4) = auVar2._0_4_;
      }
      lVar4 = lVar4 + 4;
    }
    x = (Matrix2f *)((long)x + 4);
  }
  MVar8.m_elements._0_8_ = auVar7._0_8_;
  MVar8.m_elements._8_8_ = in_ZMM1._0_8_;
  return (Matrix2f)MVar8.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}